

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O3

string * __thiscall
wabt::Decompiler::OpcodeToToken_abi_cxx11_
          (string *__return_storage_ptr__,Decompiler *this,Opcode opcode)

{
  size_type sVar1;
  pointer pcVar2;
  char *__s;
  size_type sVar3;
  allocator<char> local_d;
  Opcode local_c;
  
  local_c.enum_ = opcode.enum_;
  __s = Opcode::GetDecomp(&local_c);
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_d);
  sVar1 = __return_storage_ptr__->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      if (pcVar2[sVar3] == '.') {
        pcVar2[sVar3] = '_';
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpcodeToToken(Opcode opcode) {
    std::string s = opcode.GetDecomp();
    std::replace(s.begin(), s.end(), '.', '_');
    return s;
  }